

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spgmr.c
# Opt level: O0

int SUNLinSolSetATimes_SPGMR(SUNLinearSolver S,void *ATData,ATimesFn ATimes)

{
  ATimesFn ATimes_local;
  void *ATData_local;
  SUNLinearSolver S_local;
  
  if (S == (SUNLinearSolver)0x0) {
    S_local._4_4_ = -1;
  }
  else {
    *(ATimesFn *)((long)S->content + 0x28) = ATimes;
    *(void **)((long)S->content + 0x30) = ATData;
    *(undefined8 *)((long)S->content + 0x20) = 0;
    S_local._4_4_ = (int)*(undefined8 *)((long)S->content + 0x20);
  }
  return S_local._4_4_;
}

Assistant:

int SUNLinSolSetATimes_SPGMR(SUNLinearSolver S, void* ATData, 
                             ATimesFn ATimes)
{
  /* set function pointers to integrator-supplied ATimes routine 
     and data, and return with success */
  if (S == NULL) return(SUNLS_MEM_NULL);
  SPGMR_CONTENT(S)->ATimes = ATimes;
  SPGMR_CONTENT(S)->ATData = ATData;
  LASTFLAG(S) = SUNLS_SUCCESS;
  return(LASTFLAG(S));
}